

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-parse.h
# Opt level: O3

pair<unsigned_long,_const_char_*> parseunsigned<char_const*>(char *first,char *last,int base)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  byte *pbVar4;
  byte *pbVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  bool bVar11;
  pair<unsigned_long,_const_char_*> pVar12;
  
  if (first < last) {
    iVar8 = 0;
    iVar7 = 0;
    uVar2 = 0;
    pbVar4 = (byte *)first;
    do {
      bVar1 = *pbVar4;
      iVar6 = (int)(char)bVar1;
      uVar10 = 0xffffffff;
      if (0x2f < iVar6) {
        if (bVar1 < 0x3a) {
          uVar10 = (ulong)(iVar6 - 0x30);
        }
        else {
          uVar10 = 0xffffffff;
          if (0x40 < bVar1) {
            if (bVar1 < 0x5b) {
              uVar10 = (ulong)(iVar6 - 0x37);
            }
            else {
              uVar10 = (ulong)(iVar6 - 0x57);
              if (0x19 < (byte)(bVar1 + 0x9f)) {
                uVar10 = 0xffffffff;
              }
            }
          }
        }
      }
      uVar9 = (uint)uVar10;
      if (base == 0) {
        if (iVar7 == 1) {
          iVar7 = 3;
          if (bVar1 == 0x78) {
            base = 0x10;
          }
          else if (bVar1 == 0x62) {
            base = 2;
          }
          else {
            uVar3 = uVar2;
            if (uVar9 == 0xffffffff) goto LAB_0010993c;
            if (uVar9 < 8) {
              base = 8;
              iVar8 = 1;
              uVar2 = uVar10;
            }
            else {
              base = 0;
              iVar7 = 1;
              if (7 < (int)uVar9) goto LAB_00109922;
            }
          }
        }
        else {
          if (iVar7 != 0) goto LAB_00109922;
          if (uVar9 - 1 < 9) {
            base = 10;
            iVar8 = 1;
            iVar7 = 3;
            uVar2 = uVar10;
          }
          else {
            base = 0;
            iVar7 = 1;
            if (uVar9 != 0) goto LAB_00109922;
          }
        }
      }
      else {
        pbVar5 = pbVar4;
        if (((int)uVar9 < 0) || (base <= (int)uVar9)) break;
        iVar8 = iVar8 + 1;
        uVar2 = uVar2 * (uint)base + uVar10;
      }
      pbVar4 = pbVar4 + 1;
      pbVar5 = (byte *)last;
    } while (pbVar4 != (byte *)last);
    bVar11 = iVar8 == 0;
    if (iVar7 == 2) {
LAB_00109922:
      uVar3 = 0;
      pbVar4 = (byte *)first;
      goto LAB_0010993c;
    }
  }
  else {
    iVar7 = 0;
    bVar11 = true;
    uVar2 = 0;
    pbVar5 = (byte *)first;
  }
  uVar3 = 0;
  pbVar4 = (byte *)first;
  if (!(bool)(iVar7 == 3 & bVar11)) {
    uVar3 = uVar2;
    pbVar4 = pbVar5;
  }
LAB_0010993c:
  pVar12.second = (char *)pbVar4;
  pVar12.first = uVar3;
  return pVar12;
}

Assistant:

std::pair<uint64_t, P> parseunsigned(P first, P last, int base)
{
    int state = 0;    // 3 = foundbase, 2 = invalid, 1 = found '0', 0 = initial state.
    int digits = 0;
    uint64_t num = 0;
    auto p = first;
    while (p<last)
    {
        int n = char2nyble(*p);
        if (base==0) {
            if (state==0) {
                if (1<=n && n<=9) {
                    base = 10;
                    state = 3;
                    num = n;  // this is the first real digit
                    digits = 1;
                }
                else if (n==0) {
                    // expect 0<octal>, 0b<binary>, 0x<hex>
                    state = 1;
                }
                else {
                    // invalid
                    state = 2;
                    break;
                }
            }
            else if (state==1) {
                if (*p == 'x') {
                    base = 16;
                    state = 3;
                }
                else if (*p == 'b') {
                    base = 2;
                    state = 3;
                }
                else if (n==-1) {
                    // just a single '0' followed by a non digit
                    // -> return '0'
                    break;
                }
                else if (0<=n && n<=7) {
                    base = 8;
                    state = 3;
                    num = n;  // this is the first real digit
                    digits = 1;
                }
                else if (n>=8) {
                    // invalid octal digit
                    state = 2;
                    break;
                }
            }
            else {
                // invalid
                state = 2;
                break;
            }
        }
        else {
            if (n<0 || n>=base) {
                // end of number
                break;
            }
            num *= base;
            num += n;
            digits++;
        }

        ++p;
    }
    if (state==2)  // invalid
        return std::make_pair(0, first);

    if (state==3 && digits==0) {
        // "0x" and "0b" are invalid numbers, they expect digits.
        return std::make_pair(0, first);
    }
    return std::make_pair(num, p);
}